

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O1

int SetMotorTorqueIM483I(IM483I *pIM483I,int holdpercent,int runpercent)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int writebuflen;
  ulong uVar8;
  char *__s;
  char recvbuf [512];
  char sendbuf [512];
  timespec local_438 [32];
  uint8 local_238 [520];
  
  if (99 < holdpercent) {
    holdpercent = 100;
  }
  uVar5 = (ulong)(uint)holdpercent;
  if (holdpercent < 1) {
    uVar5 = 0;
  }
  uVar6 = 100;
  if (runpercent < 100) {
    uVar6 = runpercent;
  }
  uVar8 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar8 = 0;
  }
  memset(local_238,0,0x200);
  sprintf((char *)local_238,"Y %d %d\r",uVar5,uVar8);
  sVar2 = strlen((char *)local_238);
  writebuflen = (int)sVar2;
  iVar1 = WriteDataIM483I(pIM483I,local_238,writebuflen,pIM483I->bytedelayus);
  iVar4 = 1;
  if (iVar1 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    local_438[0].tv_sec = 0;
    local_438[0].tv_nsec = 20000000;
    nanosleep(local_438,(timespec *)0x0);
    if (pIM483I->bCheckState == 0) {
      return 0;
    }
    memset(local_438,0,0x200);
    uVar6 = writebuflen + 1;
    iVar1 = (pIM483I->RS232Port).DevType;
    __s = "Error reading data from a IM483I. ";
    if (iVar1 - 1U < 4) {
      if (-1 < writebuflen) {
        iVar1 = (pIM483I->RS232Port).s;
        uVar5 = 0;
        do {
          sVar3 = recv(iVar1,(void *)((long)&local_438[0].tv_sec + uVar5),
                       (long)(int)(uVar6 - (int)uVar5),0);
          if ((int)sVar3 < 1) goto LAB_0011a649;
          uVar7 = (int)uVar5 + (int)sVar3;
          uVar5 = (ulong)uVar7;
        } while ((int)uVar7 <= writebuflen);
      }
    }
    else {
      if (iVar1 != 0) goto LAB_0011a4d1;
      if (uVar6 != 0) {
        iVar1 = *(int *)&(pIM483I->RS232Port).hDev;
        uVar5 = 0;
        do {
          sVar3 = read(iVar1,(void *)((long)&local_438[0].tv_sec + uVar5),
                       (ulong)(uVar6 - (int)uVar5));
          if ((int)sVar3 < 1) goto LAB_0011a649;
          uVar7 = (int)uVar5 + (int)sVar3;
          uVar5 = (ulong)uVar7;
        } while (uVar7 < uVar6);
      }
    }
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(int)uVar6,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    iVar1 = strncmp((char *)local_438,(char *)local_238,(long)writebuflen);
    iVar4 = 4;
    __s = "Error reading data from a IM483I : Invalid data. ";
    if ((iVar1 == 0) && (*(char *)((long)&local_438[0].tv_sec + (long)writebuflen) == '\n')) {
      return 0;
    }
  }
  else {
    __s = "Error writing data to a IM483I. ";
  }
LAB_0011a4d1:
  puts(__s);
  return iVar4;
LAB_0011a649:
  iVar4 = 1;
  goto LAB_0011a4d1;
}

Assistant:

inline int SetMotorTorqueIM483I(IM483I* pIM483I, int holdpercent, int runpercent)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	holdpercent = max(min(holdpercent, 100), 0);
	runpercent = max(min(runpercent, 100), 0);

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "Y %d %d\r", holdpercent, runpercent);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}